

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O3

void read_long_string(LexState *ls,SemInfo *seminfo,size_t sep)

{
  int c;
  ZIO *pZVar1;
  byte *pbVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  TString *pTVar6;
  char *pcVar7;
  
  uVar4 = ls->linenumber;
  save(ls,ls->current);
  pZVar1 = ls->z;
  sVar5 = pZVar1->n;
  pZVar1->n = pZVar1->n - 1;
  if (sVar5 == 0) {
    uVar3 = luaZ_fill(pZVar1);
  }
  else {
    pbVar2 = (byte *)pZVar1->p;
    pZVar1->p = (char *)(pbVar2 + 1);
    uVar3 = (uint)*pbVar2;
  }
  ls->current = uVar3;
  if ((uVar3 == 0xd) || (uVar3 == 10)) {
    inclinenumber(ls);
  }
  do {
    while (c = ls->current, 0xc < c) {
      if (c == 0xd) goto LAB_001186df;
      if (c != 0x5d) goto LAB_00118710;
      sVar5 = skip_sep(ls);
      if (sVar5 == sep) {
        save(ls,ls->current);
        pZVar1 = ls->z;
        sVar5 = pZVar1->n;
        pZVar1->n = pZVar1->n - 1;
        if (sVar5 == 0) {
          uVar4 = luaZ_fill(pZVar1);
        }
        else {
          pbVar2 = (byte *)pZVar1->p;
          pZVar1->p = (char *)(pbVar2 + 1);
          uVar4 = (uint)*pbVar2;
        }
        ls->current = uVar4;
        if (seminfo != (SemInfo *)0x0) {
          pTVar6 = luaX_newstring(ls,ls->buff->buffer + sep,ls->buff->n + sep * -2);
          seminfo->ts = pTVar6;
        }
        return;
      }
    }
    if (c == 10) {
LAB_001186df:
      save(ls,10);
      inclinenumber(ls);
      if (seminfo == (SemInfo *)0x0) {
        ls->buff->n = 0;
      }
    }
    else {
      if (c == -1) {
        pcVar7 = "string";
        if (seminfo == (SemInfo *)0x0) {
          pcVar7 = "comment";
        }
        pcVar7 = luaO_pushfstring(ls->L,"unfinished long %s (starting at line %d)",pcVar7,
                                  (ulong)uVar4);
        lexerror(ls,pcVar7,0x120);
      }
LAB_00118710:
      if (seminfo != (SemInfo *)0x0) {
        save(ls,c);
      }
      pZVar1 = ls->z;
      sVar5 = pZVar1->n;
      pZVar1->n = pZVar1->n - 1;
      if (sVar5 == 0) {
        uVar3 = luaZ_fill(pZVar1);
      }
      else {
        pbVar2 = (byte *)pZVar1->p;
        pZVar1->p = (char *)(pbVar2 + 1);
        uVar3 = (uint)*pbVar2;
      }
      ls->current = uVar3;
    }
  } while( true );
}

Assistant:

static void read_long_string (LexState *ls, SemInfo *seminfo, size_t sep) {
  int line = ls->linenumber;  /* initial line (for error message) */
  save_and_next(ls);  /* skip 2nd '[' */
  if (currIsNewline(ls))  /* string starts with a newline? */
    inclinenumber(ls);  /* skip it */
  for (;;) {
    switch (ls->current) {
      case EOZ: {  /* error */
        const char *what = (seminfo ? "string" : "comment");
        const char *msg = luaO_pushfstring(ls->L,
                     "unfinished long %s (starting at line %d)", what, line);
        lexerror(ls, msg, TK_EOS);
        break;  /* to avoid warnings */
      }
      case ']': {
        if (skip_sep(ls) == sep) {
          save_and_next(ls);  /* skip 2nd ']' */
          goto endloop;
        }
        break;
      }
      case '\n': case '\r': {
        save(ls, '\n');
        inclinenumber(ls);
        if (!seminfo) luaZ_resetbuffer(ls->buff);  /* avoid wasting space */
        break;
      }
      default: {
        if (seminfo) save_and_next(ls);
        else next(ls);
      }
    }
  } endloop:
  if (seminfo)
    seminfo->ts = luaX_newstring(ls, luaZ_buffer(ls->buff) + sep,
                                     luaZ_bufflen(ls->buff) - 2 * sep);
}